

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_block(JSParseState *s)

{
  int iVar1;
  JSParseState *in_RDI;
  JSParseState *in_stack_00000048;
  int in_stack_000001b4;
  JSParseState *in_stack_000001b8;
  JSParseState *in_stack_ffffffffffffffe8;
  int local_4;
  
  iVar1 = js_parse_expect(in_stack_ffffffffffffffe8,0);
  if (iVar1 == 0) {
    if ((in_RDI->token).val != 0x7d) {
      push_scope(s);
      do {
        iVar1 = js_parse_statement_or_decl(in_stack_000001b8,in_stack_000001b4);
        if (iVar1 != 0) {
          return -1;
        }
      } while ((in_RDI->token).val != 0x7d);
      pop_scope(in_RDI);
    }
    iVar1 = next_token(in_stack_00000048);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static __exception int js_parse_block(JSParseState *s)
{
    if (js_parse_expect(s, '{'))
        return -1;
    if (s->token.val != '}') {
        push_scope(s);
        for(;;) {
            if (js_parse_statement_or_decl(s, DECL_MASK_ALL))
                return -1;
            if (s->token.val == '}')
                break;
        }
        pop_scope(s);
    }
    if (next_token(s))
        return -1;
    return 0;
}